

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O3

int getevents(int s,int events,int timeout)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  timeval *__timeout;
  uint uVar5;
  int sndfd;
  int rcvfd;
  size_t fdsz;
  timeval tv;
  fd_set pollset;
  uint local_c8;
  uint local_c4;
  long local_c0;
  timeval local_b8;
  fd_set local_a8;
  
  local_a8.fds_bits[0] = 0;
  local_a8.fds_bits[1] = 0;
  local_a8.fds_bits[2] = 0;
  local_a8.fds_bits[3] = 0;
  local_a8.fds_bits[4] = 0;
  local_a8.fds_bits[5] = 0;
  local_a8.fds_bits[6] = 0;
  local_a8.fds_bits[7] = 0;
  local_a8.fds_bits[8] = 0;
  local_a8.fds_bits[9] = 0;
  local_a8.fds_bits[10] = 0;
  local_a8.fds_bits[0xb] = 0;
  local_a8.fds_bits[0xc] = 0;
  local_a8.fds_bits[0xd] = 0;
  local_a8.fds_bits[0xe] = 0;
  local_a8.fds_bits[0xf] = 0;
  iVar1 = 0;
  if ((events & 1U) == 0) {
LAB_00101d6b:
    if ((events & 2U) == 0) {
LAB_00101dd3:
      if (-1 < timeout) {
        local_b8.tv_sec = (ulong)(uint)timeout / 1000;
        local_b8.tv_usec = (__suseconds_t)(((uint)timeout % 1000) * 1000);
      }
      uVar2 = 0;
      __timeout = &local_b8;
      if (timeout < 0) {
        __timeout = (timeval *)0x0;
      }
      iVar1 = select(iVar1,&local_a8,(fd_set *)0x0,(fd_set *)0x0,__timeout);
      if (-1 < iVar1) {
        if ((events & 1U) != 0) {
          uVar2 = local_c4 + 0x3f;
          if (-1 < (int)local_c4) {
            uVar2 = local_c4;
          }
          uVar2 = (uint)(((ulong)local_a8.fds_bits[(int)uVar2 >> 6] >> ((ulong)local_c4 & 0x3f) & 1)
                        != 0);
        }
        uVar5 = uVar2;
        if ((events & 2U) != 0) {
          uVar4 = local_c8 + 0x3f;
          if (-1 < (int)local_c8) {
            uVar4 = local_c8;
          }
          uVar5 = uVar2 + 2;
          if (((ulong)local_a8.fds_bits[(int)uVar4 >> 6] >> ((ulong)local_c8 & 0x3f) & 1) == 0) {
            uVar5 = uVar2;
          }
        }
        return uVar5;
      }
      getevents_cold_5();
LAB_00101e88:
      getevents_cold_1();
    }
    else {
      local_c0 = 4;
      iVar3 = nn_getsockopt(s,0,10,&local_c8);
      if (iVar3 == 0) {
        if (local_c0 != 4) goto LAB_00101e97;
        uVar2 = local_c8 + 0x3f;
        if (-1 < (int)local_c8) {
          uVar2 = local_c8;
        }
        local_a8.fds_bits[(int)uVar2 >> 6] =
             local_a8.fds_bits[(int)uVar2 >> 6] | 1L << ((byte)local_c8 & 0x3f);
        if (iVar1 <= (int)local_c8) {
          iVar1 = local_c8 + 1;
        }
        goto LAB_00101dd3;
      }
    }
    getevents_cold_3();
  }
  else {
    local_c0 = 4;
    iVar1 = nn_getsockopt(s,0,0xb,&local_c4);
    if (iVar1 != 0) goto LAB_00101e88;
    if (local_c0 == 4) {
      uVar2 = local_c4 + 0x3f;
      if (-1 < (int)local_c4) {
        uVar2 = local_c4;
      }
      iVar1 = 0;
      if (-1 < (int)local_c4) {
        iVar1 = local_c4 + 1;
      }
      local_a8.fds_bits[(int)uVar2 >> 6] =
           local_a8.fds_bits[(int)uVar2 >> 6] | 1L << ((byte)((int)local_c4 % 0x40) & 0x3f);
      goto LAB_00101d6b;
    }
  }
  getevents_cold_2();
LAB_00101e97:
  getevents_cold_4();
}

Assistant:

int getevents (int s, int events, int timeout)
{
    int rc;
    fd_set pollset;
#if defined NN_HAVE_WINDOWS
    SOCKET rcvfd;
    SOCKET sndfd;
#else
    int rcvfd;
    int sndfd;
    int maxfd;
#endif
    size_t fdsz;
    struct timeval tv;
    int revents;

#if !defined NN_HAVE_WINDOWS
    maxfd = 0;
#endif
    FD_ZERO (&pollset);

    if (events & NN_IN) {
        fdsz = sizeof (rcvfd);
        rc = nn_getsockopt (s, NN_SOL_SOCKET, NN_RCVFD, (char*) &rcvfd, &fdsz);
        errno_assert (rc == 0);
        nn_assert (fdsz == sizeof (rcvfd));
        FD_SET (rcvfd, &pollset);
#if !defined NN_HAVE_WINDOWS
        if (rcvfd + 1 > maxfd)
            maxfd = rcvfd + 1;
#endif
    }

    if (events & NN_OUT) {
        fdsz = sizeof (sndfd);
        rc = nn_getsockopt (s, NN_SOL_SOCKET, NN_SNDFD, (char*) &sndfd, &fdsz);
        errno_assert (rc == 0);
        nn_assert (fdsz == sizeof (sndfd));
        FD_SET (sndfd, &pollset);
#if !defined NN_HAVE_WINDOWS
        if (sndfd + 1 > maxfd)
            maxfd = sndfd + 1;
#endif
    }

    if (timeout >= 0) {
        tv.tv_sec = timeout / 1000;
        tv.tv_usec = (timeout % 1000) * 1000;
    }
#if defined NN_HAVE_WINDOWS
    rc = select (0, &pollset, NULL, NULL, timeout < 0 ? NULL : &tv);
    wsa_assert (rc != SOCKET_ERROR);
#else
    rc = select (maxfd, &pollset, NULL, NULL, timeout < 0 ? NULL : &tv);
    errno_assert (rc >= 0);
#endif
    revents = 0;
    if ((events & NN_IN) && FD_ISSET (rcvfd, &pollset))
        revents |= NN_IN;
    if ((events & NN_OUT) && FD_ISSET (sndfd, &pollset))
        revents |= NN_OUT;
    return revents;
}